

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderHelperInvocationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::FboHelper::FboHelper
          (FboHelper *this,RenderContext *renderCtx,int width,int height,deUint32 format,
          int numSamples)

{
  glBindRenderbufferFunc p_Var1;
  glBindFramebufferFunc p_Var2;
  glFramebufferRenderbufferFunc p_Var3;
  int iVar4;
  deUint32 dVar5;
  GLenum GVar6;
  deBool dVar7;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  TestError *pTVar8;
  allocator<char> local_69;
  string local_68;
  int local_44;
  Functions *pFStack_40;
  int maxSamples;
  Functions *gl;
  int local_28;
  deUint32 local_24;
  int numSamples_local;
  deUint32 format_local;
  int height_local;
  int width_local;
  RenderContext *renderCtx_local;
  FboHelper *this_local;
  
  this->m_renderCtx = renderCtx;
  this->m_numSamples = numSamples;
  local_28 = numSamples;
  local_24 = format;
  numSamples_local = height;
  format_local = width;
  _height_local = renderCtx;
  renderCtx_local = (RenderContext *)this;
  tcu::Vector<int,_2>::Vector(&this->m_size,width,height);
  glu::TypedObjectWrapper<(glu::ObjectType)2>::TypedObjectWrapper
            (&this->m_colorbuffer,_height_local);
  glu::TypedObjectWrapper<(glu::ObjectType)3>::TypedObjectWrapper
            (&this->m_framebuffer,_height_local);
  glu::TypedObjectWrapper<(glu::ObjectType)2>::TypedObjectWrapper
            (&this->m_resolveColorbuffer,_height_local);
  glu::TypedObjectWrapper<(glu::ObjectType)3>::TypedObjectWrapper
            (&this->m_resolveFramebuffer,_height_local);
  iVar4 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  pFStack_40 = (Functions *)CONCAT44(extraout_var,iVar4);
  local_44 = getInteger(pFStack_40,0x8d57);
  p_Var1 = pFStack_40->bindRenderbuffer;
  dVar5 = glu::ObjectWrapper::operator*(&(this->m_colorbuffer).super_ObjectWrapper);
  (*p_Var1)(0x8d41,dVar5);
  (*pFStack_40->renderbufferStorageMultisample)
            (0x8d41,this->m_numSamples,local_24,format_local,numSamples_local);
  p_Var2 = pFStack_40->bindFramebuffer;
  dVar5 = glu::ObjectWrapper::operator*(&(this->m_framebuffer).super_ObjectWrapper);
  (*p_Var2)(0x8d40,dVar5);
  p_Var3 = pFStack_40->framebufferRenderbuffer;
  dVar5 = glu::ObjectWrapper::operator*(&(this->m_colorbuffer).super_ObjectWrapper);
  (*p_Var3)(0x8d40,0x8ce0,0x8d41,dVar5);
  if ((local_44 < this->m_numSamples) &&
     (GVar6 = (*pFStack_40->checkFramebufferStatus)(0x8d40), GVar6 != 0x8cd5)) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"Sample count exceeds GL_MAX_SAMPLES",&local_69);
    tcu::NotSupportedError::NotSupportedError(this_00,&local_68);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  do {
    dVar7 = ::deGetFalse();
    if ((dVar7 != 0) || (GVar6 = (*pFStack_40->checkFramebufferStatus)(0x8d40), GVar6 != 0x8cd5)) {
      pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar8,(char *)0x0,
                 "gl.checkFramebufferStatus(GL_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderHelperInvocationTests.cpp"
                 ,0xf0);
      __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    dVar7 = ::deGetFalse();
  } while (dVar7 != 0);
  if (this->m_numSamples != 0) {
    p_Var1 = pFStack_40->bindRenderbuffer;
    dVar5 = glu::ObjectWrapper::operator*(&(this->m_resolveColorbuffer).super_ObjectWrapper);
    (*p_Var1)(0x8d41,dVar5);
    (*pFStack_40->renderbufferStorage)(0x8d41,local_24,format_local,numSamples_local);
    p_Var2 = pFStack_40->bindFramebuffer;
    dVar5 = glu::ObjectWrapper::operator*(&(this->m_resolveFramebuffer).super_ObjectWrapper);
    (*p_Var2)(0x8d40,dVar5);
    p_Var3 = pFStack_40->framebufferRenderbuffer;
    dVar5 = glu::ObjectWrapper::operator*(&(this->m_resolveColorbuffer).super_ObjectWrapper);
    (*p_Var3)(0x8d40,0x8ce0,0x8d41,dVar5);
    do {
      dVar7 = ::deGetFalse();
      if ((dVar7 != 0) || (GVar6 = (*pFStack_40->checkFramebufferStatus)(0x8d40), GVar6 != 0x8cd5))
      {
        pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar8,(char *)0x0,
                   "gl.checkFramebufferStatus(GL_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderHelperInvocationTests.cpp"
                   ,0xf8);
        __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      dVar7 = ::deGetFalse();
    } while (dVar7 != 0);
  }
  GVar6 = (*pFStack_40->getError)();
  glu::checkError(GVar6,"Failed to create framebuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderHelperInvocationTests.cpp"
                  ,0xfb);
  return;
}

Assistant:

FboHelper::FboHelper (const glu::RenderContext& renderCtx, int width, int height, deUint32 format, int numSamples)
	: m_renderCtx			(renderCtx)
	, m_numSamples			(numSamples)
	, m_size				(width, height)
	, m_colorbuffer			(renderCtx)
	, m_framebuffer			(renderCtx)
	, m_resolveColorbuffer	(renderCtx)
	, m_resolveFramebuffer	(renderCtx)
{
	const glw::Functions&	gl			= m_renderCtx.getFunctions();
	const int				maxSamples	= getInteger(gl, GL_MAX_SAMPLES);

	gl.bindRenderbuffer(GL_RENDERBUFFER, *m_colorbuffer);
	gl.renderbufferStorageMultisample(GL_RENDERBUFFER, m_numSamples, format, width, height);
	gl.bindFramebuffer(GL_FRAMEBUFFER, *m_framebuffer);
	gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, *m_colorbuffer);

	if (m_numSamples > maxSamples && gl.checkFramebufferStatus(GL_FRAMEBUFFER) != GL_FRAMEBUFFER_COMPLETE)
		throw tcu::NotSupportedError("Sample count exceeds GL_MAX_SAMPLES");

	TCU_CHECK(gl.checkFramebufferStatus(GL_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE);

	if (m_numSamples != 0)
	{
		gl.bindRenderbuffer(GL_RENDERBUFFER, *m_resolveColorbuffer);
		gl.renderbufferStorage(GL_RENDERBUFFER, format, width, height);
		gl.bindFramebuffer(GL_FRAMEBUFFER, *m_resolveFramebuffer);
		gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, *m_resolveColorbuffer);
		TCU_CHECK(gl.checkFramebufferStatus(GL_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE);
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to create framebuffer");
}